

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,uint8_t mask)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  uint pos;
  byte in_DL;
  long in_RDI;
  long in_FS_OFFSET;
  uint8_t bits;
  size_t i;
  uint8_t n;
  CSubNet *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CNetAddr *in_stack_ffffffffffffff98;
  bool local_4b;
  bool local_49;
  ulong local_38;
  byte local_2d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet(in_stack_ffffffffffffff88);
  bVar3 = CNetAddr::IsIPv4(&in_stack_ffffffffffffff88->network);
  if ((!bVar3) || (local_49 = true, 0x20 < in_DL)) {
    local_4b = CNetAddr::IsIPv6(&in_stack_ffffffffffffff88->network);
    local_4b = local_4b && in_DL < 0x81;
    local_49 = local_4b;
  }
  *(bool *)(in_RDI + 0x30) = local_49;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    if (0x80 < in_DL) {
      __assert_fail("mask <= sizeof(netmask) * 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x3a2,"CSubNet::CSubNet(const CNetAddr &, uint8_t)");
    }
    CNetAddr::operator=(in_stack_ffffffffffffff98,
                        (CNetAddr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_2d = in_DL;
    for (local_38 = 0;
        sVar4 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                          (&in_stack_ffffffffffffff98->m_addr), local_38 < sVar4;
        local_38 = local_38 + 1) {
      bVar2 = local_2d;
      if (7 < local_2d) {
        bVar2 = 8;
      }
      *(char *)(in_RDI + 0x20 + local_38) = (char)(0xff << (8 - bVar2 & 0x1f));
      pos = (uint)*(byte *)(in_RDI + 0x20 + local_38);
      in_stack_ffffffffffffff98 =
           (CNetAddr *)
           prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                     (&in_stack_ffffffffffffff98->m_addr,pos);
      (in_stack_ffffffffffffff98->m_addr)._union.direct[0] =
           (in_stack_ffffffffffffff98->m_addr)._union.direct[0] & (byte)pos;
      local_2d = local_2d - bVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, uint8_t mask) : CSubNet()
{
    valid = (addr.IsIPv4() && mask <= ADDR_IPV4_SIZE * 8) ||
            (addr.IsIPv6() && mask <= ADDR_IPV6_SIZE * 8);
    if (!valid) {
        return;
    }

    assert(mask <= sizeof(netmask) * 8);

    network = addr;

    uint8_t n = mask;
    for (size_t i = 0; i < network.m_addr.size(); ++i) {
        const uint8_t bits = n < 8 ? n : 8;
        netmask[i] = (uint8_t)((uint8_t)0xFF << (8 - bits)); // Set first bits.
        network.m_addr[i] &= netmask[i]; // Normalize network according to netmask.
        n -= bits;
    }
}